

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-getrandom.c
# Opt level: O1

int uv__random_getrandom(void *buf,size_t buflen)

{
  ssize_t sVar1;
  int *piVar2;
  size_t sVar3;
  size_t buflen_00;
  
  if (buflen == 0) {
    return 0;
  }
  sVar3 = 0;
  while( true ) {
    buflen_00 = buflen - sVar3;
    if (0xff < (long)buflen_00) {
      buflen_00 = 0x100;
    }
    while (sVar1 = uv__getrandom((void *)((long)buf + sVar3),buflen_00,0), sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        return -*piVar2;
      }
    }
    if (sVar1 == 0) break;
    sVar3 = sVar3 + sVar1;
    if (sVar3 == buflen) {
      return 0;
    }
  }
  return -5;
}

Assistant:

int uv__random_getrandom(void* buf, size_t buflen) {
  ssize_t n;
  size_t pos;
  int rc;

  rc = uv__random_getrandom_init();
  if (rc != 0)
    return rc;

  for (pos = 0; pos != buflen; pos += n) {
    do {
      n = buflen - pos;

      /* Most getrandom() implementations promise that reads <= 256 bytes
       * will always succeed and won't be interrupted by signals.
       * It's therefore useful to split it up in smaller reads because
       * one big read may, in theory, continuously fail with EINTR.
       */
      if (n > 256)
        n = 256;

      n = uv__getrandom((char *) buf + pos, n, 0);
    } while (n == -1 && errno == EINTR);

    if (n == -1)
      return UV__ERR(errno);

    if (n == 0)
      return UV_EIO;
  }

  return 0;
}